

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::updateStatus(HEkk *this,LpAction action)

{
  undefined4 in_ESI;
  HEkk *in_RDI;
  
  switch(in_ESI) {
  case 0:
    invalidateBasisMatrix((HEkk *)0x7681f9);
    break;
  case 1:
    (in_RDI->status_).has_fresh_rebuild = false;
    (in_RDI->status_).has_dual_objective_value = false;
    (in_RDI->status_).has_primal_objective_value = false;
    break;
  case 2:
    (in_RDI->status_).has_fresh_rebuild = false;
    (in_RDI->status_).has_dual_objective_value = false;
    (in_RDI->status_).has_primal_objective_value = false;
    break;
  case 3:
    invalidateBasis((HEkk *)0x768246);
    break;
  case 4:
    clear(in_RDI);
    break;
  case 5:
    clear(in_RDI);
    break;
  case 6:
    clear(in_RDI);
    break;
  case 7:
    clear(in_RDI);
    break;
  case 8:
    clear(in_RDI);
    break;
  case 9:
    break;
  case 10:
    invalidateBasisMatrix((HEkk *)0x768290);
    break;
  case 0xb:
    invalidateBasisMatrix((HEkk *)0x76829c);
    break;
  case 0xc:
    (in_RDI->status_).has_ar_matrix = false;
    (in_RDI->status_).has_fresh_rebuild = false;
    (in_RDI->status_).has_dual_objective_value = false;
    (in_RDI->status_).has_primal_objective_value = false;
  }
  return;
}

Assistant:

void HEkk::updateStatus(LpAction action) {
  assert(!this->status_.is_dualized);
  assert(!this->status_.is_permuted);
  switch (action) {
    case LpAction::kScale:
      this->invalidateBasisMatrix();
      break;
    case LpAction::kNewCosts:
      this->status_.has_fresh_rebuild = false;
      this->status_.has_dual_objective_value = false;
      this->status_.has_primal_objective_value = false;
      break;
    case LpAction::kNewBounds:
      this->status_.has_fresh_rebuild = false;
      this->status_.has_dual_objective_value = false;
      this->status_.has_primal_objective_value = false;
      break;
    case LpAction::kNewBasis:
      this->invalidateBasis();
      break;
    case LpAction::kNewCols:
      this->clear();
      //    this->invalidateBasisArtifacts();
      break;
    case LpAction::kNewRows:
      if (kExtendInvertWhenAddingRows) {
        // Just clear Ekk data
        this->clearEkkData();
      } else {
        // Clear everything
        this->clear();
      }
      //    this->invalidateBasisArtifacts();
      break;
    case LpAction::kDelCols:
      this->clear();
      //    this->invalidateBasis();
      break;
    case LpAction::kDelNonbasicCols:
      this->clear();
      //    this->invalidateBasis();
      break;
    case LpAction::kDelRows:
      this->clear();
      //   this->invalidateBasis();
      break;
    case LpAction::kDelRowsBasisOk:
      assert(1 == 0);
      //      info.lp_ = true;
      break;
    case LpAction::kScaledCol:
      this->invalidateBasisMatrix();
      break;
    case LpAction::kScaledRow:
      this->invalidateBasisMatrix();
      break;
    case LpAction::kBacktracking:
      this->status_.has_ar_matrix = false;
      this->status_.has_fresh_rebuild = false;
      this->status_.has_dual_objective_value = false;
      this->status_.has_primal_objective_value = false;
      break;
    default:
      break;
  }
}